

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,undefined4 param_2)

{
  char *pcVar1;
  char cVar2;
  
  switch(param_2) {
  case 0:
    cVar2 = 't';
    goto LAB_0012f652;
  case 1:
    cVar2 = 'f';
LAB_0012f652:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = cVar2;
    return this;
  case 2:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'h';
    goto LAB_0012f5fc;
  case 3:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
    break;
  case 4:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'c';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'c';
    return this;
  case 5:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'c';
    break;
  case 6:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'n';
    goto LAB_0012f6ae;
  case 7:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'e';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'q';
    return this;
  case 8:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'v';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'c';
    return this;
  case 9:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'v';
    break;
  case 10:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'p';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
    return this;
  case 0xb:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'm';
LAB_0012f5fc:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'i';
    return this;
  case 0xc:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'g';
    goto LAB_0012f6ae;
  case 0xd:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
    goto LAB_0012f68f;
  case 0xe:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'g';
LAB_0012f68f:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 't';
    return this;
  case 0xf:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
LAB_0012f6ae:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'e';
    return this;
  default:
    return this;
  }
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = 's';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cc cc)
{
    switch (Cond(cc.raw)) {

        case Cond::BT: *this << "t";   break;
        case Cond::BF: *this << "f";   break;
        case Cond::HI: *this << "hi";  break;
        case Cond::LS: *this << "ls";  break;
        case Cond::CC: *this << "cc";  break;
        case Cond::CS: *this << "cs";  break;
        case Cond::NE: *this << "ne";  break;
        case Cond::EQ: *this << "eq";  break;
        case Cond::VC: *this << "vc";  break;
        case Cond::VS: *this << "vs";  break;
        case Cond::PL: *this << "pl";  break;
        case Cond::MI: *this << "mi";  break;
        case Cond::GE: *this << "ge";  break;
        case Cond::LT: *this << "lt";  break;
        case Cond::GT: *this << "gt";  break;
        case Cond::LE: *this << "le";  break;
    }
    return *this;
}